

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateRankCount
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,string *layerType,
                   int min,int max,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *blobNameToRank)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  bool bVar3;
  LogMessage *pLVar4;
  iterator iVar5;
  mapped_type_conflict1 *pmVar6;
  string local_90;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  string *local_38;
  
  local_38 = layerType;
  Result::Result(__return_storage_ptr__);
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_70,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_70);
  }
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&blobNameToRank->_M_t,
                 (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  p_Var1 = &(blobNameToRank->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_70,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_70);
    }
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::at(blobNameToRank,
                  (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    iVar2 = *pmVar6;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"input","");
    checkRank((Result *)local_70,layer,local_38,min,max,&local_90,iVar2);
    __return_storage_ptr__->m_type = local_70._0_4_;
    __return_storage_ptr__->m_reason = local_70._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != local_58) {
      operator_delete(local_68._M_p,(ulong)(local_58[0]._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_70,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_70);
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&blobNameToRank->_M_t,
                   (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
      if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar4 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_70,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar4);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_70);
      }
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(blobNameToRank,
                    (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      iVar2 = *pmVar6;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"output","");
      checkRank((Result *)local_70,layer,local_38,min,max,&local_90,iVar2);
      __return_storage_ptr__->m_type = local_70._0_4_;
      __return_storage_ptr__->m_reason = local_70._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->m_message,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != local_58) {
        operator_delete(local_68._M_p,(ulong)(local_58[0]._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateRankCount(const Specification::NeuralNetworkLayer& layer,
                                const std::string &layerType, int min, int max,
                                std::map<std::string, int>& blobNameToRank) {
    
    Result r;
    
    // check that 1st input's rank is within permissible limits
    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
        int rank = blobNameToRank.at(layer.input(0));
        r = checkRank(layer, layerType, min, max, "input", rank);
    }
    
    if (!r.good()) {return r;}
    
    // check that 2nd input's rank is within permissible limits
    if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
        int rank = blobNameToRank.at(layer.output(0));
        r = checkRank(layer, layerType, min, max, "output", rank);
    }
    return r;
}